

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O3

Gia_Man_t * Nf_ManDeriveMapping(Nf_Man_t *p)

{
  uint *puVar1;
  long lVar2;
  int iVar3;
  Nf_Cfg_t NVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Nf_Obj_t *pNVar7;
  bool bVar8;
  int iVar9;
  Vec_Int_t *p_00;
  int *__ptr;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  byte bVar16;
  uint uVar17;
  size_t __size;
  int iVar18;
  ulong uVar19;
  Nf_Mat_t *pNVar20;
  bool bVar21;
  Gia_Man_t *pGVar22;
  int **local_58;
  
  pGVar22 = p->pGia;
  if (pGVar22->vCellMapping != (Vec_Int_t *)0x0) {
    __assert_fail("p->pGia->vCellMapping == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                  ,0x811,"Gia_Man_t *Nf_ManDeriveMapping(Nf_Man_t *)");
  }
  iVar9 = pGVar22->nObjs;
  iVar3 = (int)p->pPars->Edge;
  iVar18 = (int)p->pPars->Area + iVar9;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar14 = 0x10;
  if (0xe < (iVar3 + iVar18 * 2) - 1U) {
    iVar14 = iVar3 + iVar18 * 2;
  }
  p_00->nCap = iVar14;
  if (iVar14 == 0) {
    p_00->pArray = (int *)0x0;
    uVar15 = iVar9 * 2;
    uVar19 = (ulong)uVar15;
    if (iVar9 < 1) {
      __ptr = (int *)0x0;
      goto LAB_00739dcf;
    }
    __size = uVar19 << 2;
LAB_00739d95:
    __ptr = (int *)malloc(__size);
LAB_00739d9d:
    local_58 = &p_00->pArray;
    *local_58 = __ptr;
    if (__ptr == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p_00->nCap = (int)uVar19;
  }
  else {
    __ptr = (int *)malloc((long)iVar14 << 2);
    p_00->pArray = __ptr;
    uVar19 = (long)iVar9 * 2;
    if (iVar14 < (int)uVar19) {
      __size = (long)iVar9 << 3;
      if (__ptr == (int *)0x0) goto LAB_00739d95;
      __ptr = (int *)realloc(__ptr,__size);
      goto LAB_00739d9d;
    }
  }
  uVar15 = (uint)uVar19;
  if (0 < (int)uVar15) {
    memset(__ptr,0,(uVar19 & 0xffffffff) << 2);
  }
LAB_00739dcf:
  local_58 = &p_00->pArray;
  p_00->nSize = uVar15;
  pVVar5 = pGVar22->vCis;
  iVar9 = pVVar5->nSize;
  if (0 < iVar9) {
    piVar6 = pVVar5->pArray;
    lVar13 = 0;
    do {
      uVar17 = piVar6[lVar13];
      if (((int)uVar17 < 0) || (pGVar22->nObjs <= (int)uVar17)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if ((ulong)uVar17 == 0) goto LAB_00739e4a;
      lVar2 = (ulong)uVar17 * 2 + 1;
      if ((p->vMapRefs).nSize <= (int)lVar2) goto LAB_0073a0c8;
      if ((p->vMapRefs).pArray[lVar2] != 0) {
        if ((int)uVar15 <= (int)lVar2) goto LAB_0073a0e7;
        __ptr[lVar2] = -1;
        iVar9 = pVVar5->nSize;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < iVar9);
  }
  if (0 < pGVar22->nObjs) {
LAB_00739e4a:
    lVar13 = 0;
    do {
      uVar15 = (uint)*(undefined8 *)(pGVar22->pObjs + lVar13);
      if ((~uVar15 & 0x1fffffff) != 0 && -1 < (int)uVar15) {
        uVar19 = lVar13 * 2;
        if (((uVar15 & 0x1fffffff) == 0x1fffffff) ||
           ((uVar15 & 0x1fffffff) !=
            ((uint)((ulong)*(undefined8 *)(pGVar22->pObjs + lVar13) >> 0x20) & 0x1fffffff))) {
          uVar10 = 0;
          bVar8 = true;
          do {
            bVar21 = bVar8;
            uVar11 = uVar10 | uVar19;
            iVar9 = (int)uVar11;
            if ((p->vMapRefs).nSize <= iVar9) goto LAB_0073a0c8;
            if ((p->vMapRefs).pArray[uVar11] != 0) {
              pNVar7 = p->pNfObjs;
              uVar15 = *(uint *)pNVar7[lVar13].M[uVar10];
              uVar17 = *(uint *)(pNVar7[lVar13].M[uVar10] + 1);
              if (-1 < (int)(uVar17 ^ uVar15)) {
                __assert_fail("pD->fBest != pA->fBest",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                              ,0x57b,"Nf_Mat_t *Nf_ObjMatchBest(Nf_Man_t *, int, int)");
              }
              pNVar20 = (Nf_Mat_t *)0x0;
              if ((int)uVar15 < 0) {
                pNVar20 = pNVar7[lVar13].M[uVar10];
              }
              if ((int)uVar17 < 0) {
                pNVar20 = pNVar7[lVar13].M[uVar10] + 1;
              }
              if ((*(uint *)&pNVar20->field_0x0 >> 0x1e & 1) == 0) {
                if ((p->vCutSets).nSize <= lVar13) goto LAB_0073a0c8;
                uVar15 = (p->vCutSets).pArray[lVar13];
                uVar17 = (int)uVar15 >> 0x10;
                if (((int)uVar17 < 0) || ((p->vPages).nSize <= (int)uVar17)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                }
                uVar12 = *(uint *)&pNVar20->field_0x0 >> 0x14 & 0x3ff;
                if (uVar12 == 0) {
                  __assert_fail("h > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                                ,0x93,"int *Nf_CutFromHandle(int *, int)");
                }
                if (p_00->nSize <= iVar9) goto LAB_0073a0e7;
                puVar1 = (uint *)((long)(p->vPages).pArray[uVar17] +
                                 (ulong)uVar12 * 4 + (ulong)(uVar15 & 0xffff) * 4);
                p_00->pArray[uVar11] = p_00->nSize;
                Vec_IntPush(p_00,*puVar1 & 0x1f);
                if ((*puVar1 & 0x1f) != 0) {
                  bVar16 = 0;
                  uVar15 = 0;
                  do {
                    NVar4 = ((Nf_Mat_t *)&pNVar20->field_0x0)->Cfg;
                    uVar17 = puVar1[(ulong)(((uint)NVar4 >> 8) >> (bVar16 & 0x1f) & 0xf) + 1];
                    if (uVar17 == 0) break;
                    if ((int)uVar17 < 0) {
                      __assert_fail("Var >= 0 && !(c >> 1)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                                    ,0xf1,"int Abc_Var2Lit(int, int)");
                    }
                    Vec_IntPush(p_00,(uint)((((uint)NVar4 >> 1 & 0x7f) >> (uVar15 & 0x1f) & 1) != 0)
                                     + uVar17 * 2);
                    uVar15 = uVar15 + 1;
                    bVar16 = bVar16 + 4;
                  } while (uVar15 < (*puVar1 & 0x1f));
                }
                Vec_IntPush(p_00,*(uint *)&pNVar20->field_0x0 & 0xfffff);
              }
              else {
                if (p_00->nSize <= iVar9) goto LAB_0073a0e7;
                (*local_58)[uVar11] = -1;
              }
            }
            uVar10 = 1;
            bVar8 = false;
          } while (bVar21);
          pGVar22 = p->pGia;
        }
        else {
          uVar10 = uVar19 | 1;
          if ((p->vMapRefs).nSize <= (int)uVar10) {
LAB_0073a0c8:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar9 = p_00->nSize;
          if ((p->vMapRefs).pArray[uVar10] != 0) {
            if (iVar9 <= (int)uVar10) {
LAB_0073a0e7:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            (*local_58)[uVar10] = -1;
          }
          if (iVar9 <= (int)uVar19) goto LAB_0073a0e7;
          (*local_58)[lVar13 * 2] = -2;
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < pGVar22->nObjs);
  }
  pGVar22->vCellMapping = p_00;
  return pGVar22;
}

Assistant:

Gia_Man_t * Nf_ManDeriveMapping( Nf_Man_t * p )
{
    Vec_Int_t * vMapping;
    Nf_Mat_t * pM;
    int i, k, c, Id, iVar, fCompl, * pCut;
    assert( p->pGia->vCellMapping == NULL );
    vMapping = Vec_IntAlloc( 2*Gia_ManObjNum(p->pGia) + (int)p->pPars->Edge + (int)p->pPars->Area * 2 );
    Vec_IntFill( vMapping, 2*Gia_ManObjNum(p->pGia), 0 );
    // create CI inverters
    Gia_ManForEachCiId( p->pGia, Id, i )
    if ( Nf_ObjMapRefNum(p, Id, 1) )
        Vec_IntWriteEntry( vMapping, Abc_Var2Lit(Id, 1), -1 );
    // create internal nodes
    Gia_ManForEachAndId( p->pGia, i )
    {
        Gia_Obj_t * pObj = Gia_ManObj(p->pGia, i);
        if ( Gia_ObjIsBuf(pObj) )
        {
            if ( Nf_ObjMapRefNum(p, i, 1) )
                Vec_IntWriteEntry( vMapping, Abc_Var2Lit(i, 1), -1 );
            Vec_IntWriteEntry( vMapping, Abc_Var2Lit(i, 0), -2 );
            continue;
        }
        for ( c = 0; c < 2; c++ )
        if ( Nf_ObjMapRefNum(p, i, c) )
        {
            pM = Nf_ObjMatchBest( p, i, c );
            // remember inverter
            if ( pM->fCompl )
            {
                Vec_IntWriteEntry( vMapping, Abc_Var2Lit(i, c), -1 );
                continue;
            }
    //        Nf_ManCutMatchPrint( p, i, c, pM );
            pCut = Nf_CutFromHandle( Nf_ObjCutSet(p, i), pM->CutH );
            Vec_IntWriteEntry( vMapping, Abc_Var2Lit(i, c), Vec_IntSize(vMapping) );
            Vec_IntPush( vMapping, Nf_CutSize(pCut) );
            Nf_CutForEachVarCompl( pCut, pM->Cfg, iVar, fCompl, k )
                Vec_IntPush( vMapping, Abc_Var2Lit(iVar, fCompl) );
            Vec_IntPush( vMapping, pM->Gate );
        }
    }
//    assert( Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping) );
    p->pGia->vCellMapping = vMapping;
    return p->pGia;
}